

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ast_to_hir.cpp
# Opt level: O0

void apply_explicit_binding
               (_mesa_glsl_parse_state *state,YYLTYPE *loc,ir_variable *var,glsl_type *type,
               ast_type_qualifier *qual)

{
  long lVar1;
  bool bVar2;
  uint uVar3;
  glsl_type *this;
  uint local_58;
  uint limit;
  glsl_type *base_type;
  uint max_index;
  uint elements;
  gl_context *ctx;
  ast_type_qualifier *paStack_30;
  uint qual_binding;
  ast_type_qualifier *qual_local;
  glsl_type *type_local;
  ir_variable *var_local;
  YYLTYPE *loc_local;
  _mesa_glsl_parse_state *state_local;
  
  paStack_30 = qual;
  qual_local = (ast_type_qualifier *)type;
  type_local = (glsl_type *)var;
  var_local = (ir_variable *)loc;
  loc_local = (YYLTYPE *)state;
  if (((*(ulong *)&qual->flags >> 10 & 1) == 0) && ((*(ulong *)&qual->flags >> 0xb & 1) == 0)) {
    _mesa_glsl_error(loc,state,
                     "the \"binding\" qualifier only applies to uniforms and shader storage buffer objects"
                    );
  }
  else {
    bVar2 = process_qualifier_constant(state,loc,"binding",qual->binding,(uint *)((long)&ctx + 4));
    if (bVar2) {
      lVar1 = *(long *)loc_local;
      bVar2 = glsl_type::is_array((glsl_type *)qual_local);
      if (bVar2) {
        local_58 = glsl_type::arrays_of_arrays_size((glsl_type *)qual_local);
      }
      else {
        local_58 = 1;
      }
      uVar3 = (ctx._4_4_ + local_58) - 1;
      this = glsl_type::without_array((glsl_type *)qual_local);
      bVar2 = glsl_type::is_interface(this);
      if (bVar2) {
        if (((*(ulong *)&paStack_30->flags >> 10 & 1) != 0) && (*(uint *)(lVar1 + 0x11110) <= uVar3)
           ) {
          _mesa_glsl_error((YYLTYPE *)var_local,(_mesa_glsl_parse_state *)loc_local,
                           "layout(binding = %u) for %d UBOs exceeds the maximum number of UBO binding points (%d)"
                           ,(ulong)ctx._4_4_,(ulong)local_58,(ulong)*(uint *)(lVar1 + 0x11110));
          return;
        }
        if (((*(ulong *)&paStack_30->flags >> 0xb & 1) != 0) &&
           (*(uint *)(lVar1 + 0x11120) <= uVar3)) {
          _mesa_glsl_error((YYLTYPE *)var_local,(_mesa_glsl_parse_state *)loc_local,
                           "layout(binding = %u) for %d SSBOs exceeds the maximum number of SSBO binding points (%d)"
                           ,(ulong)ctx._4_4_,(ulong)local_58,(ulong)*(uint *)(lVar1 + 0x11120));
          return;
        }
      }
      else {
        bVar2 = glsl_type::is_sampler(this);
        if (bVar2) {
          if (*(uint *)(lVar1 + 0x10c6c) <= uVar3) {
            _mesa_glsl_error((YYLTYPE *)var_local,(_mesa_glsl_parse_state *)loc_local,
                             "layout(binding = %d) for %d samplers exceeds the maximum number of texture image units (%u)"
                             ,(ulong)ctx._4_4_,(ulong)local_58,(ulong)*(uint *)(lVar1 + 0x10c6c));
            return;
          }
        }
        else {
          bVar2 = glsl_type::contains_atomic(this);
          if (bVar2) {
            if (0x5a < *(uint *)(lVar1 + 0x113c0)) {
              __assert_fail("ctx->Const.MaxAtomicBufferBindings <= MAX_COMBINED_ATOMIC_BUFFERS",
                            "/workspace/llm4binary/github/license_all_cmakelists_1510/jamienicol[P]glsl-optimizer/src/compiler/glsl/ast_to_hir.cpp"
                            ,0xb8e,
                            "void apply_explicit_binding(struct _mesa_glsl_parse_state *, YYLTYPE *, ir_variable *, const glsl_type *, const ast_type_qualifier *)"
                           );
            }
            if (*(uint *)(lVar1 + 0x113c0) <= ctx._4_4_) {
              _mesa_glsl_error((YYLTYPE *)var_local,(_mesa_glsl_parse_state *)loc_local,
                               "layout(binding = %d) exceeds the maximum number of atomic counter buffer bindings (%u)"
                               ,(ulong)ctx._4_4_,(ulong)*(uint *)(lVar1 + 0x113c0));
              return;
            }
          }
          else {
            bVar2 = _mesa_glsl_parse_state::is_version
                              ((_mesa_glsl_parse_state *)loc_local,0x1a4,0x136);
            if (((!bVar2) && ((loc_local[0x19].last_line & 0x100) == 0)) ||
               (bVar2 = glsl_type::is_image(this), !bVar2)) {
              _mesa_glsl_error((YYLTYPE *)var_local,(_mesa_glsl_parse_state *)loc_local,
                               "the \"binding\" qualifier only applies to uniform blocks, storage blocks, opaque variables, or arrays thereof"
                              );
              return;
            }
            if (0xc0 < *(uint *)(lVar1 + 0x113d8)) {
              __assert_fail("ctx->Const.MaxImageUnits <= MAX_IMAGE_UNITS",
                            "/workspace/llm4binary/github/license_all_cmakelists_1510/jamienicol[P]glsl-optimizer/src/compiler/glsl/ast_to_hir.cpp"
                            ,0xb9a,
                            "void apply_explicit_binding(struct _mesa_glsl_parse_state *, YYLTYPE *, ir_variable *, const glsl_type *, const ast_type_qualifier *)"
                           );
            }
            if (*(uint *)(lVar1 + 0x113d8) <= uVar3) {
              _mesa_glsl_error((YYLTYPE *)var_local,(_mesa_glsl_parse_state *)loc_local,
                               "Image binding %d exceeds the maximum number of image units (%d)",
                               (ulong)uVar3,(ulong)*(uint *)(lVar1 + 0x113d8));
              return;
            }
          }
        }
      }
      *(uint *)&type_local[1].name = *(uint *)&type_local[1].name & 0xffefffff | 0x100000;
      *(short *)&type_local[1].field_0x1e = (short)ctx._4_4_;
    }
  }
  return;
}

Assistant:

static void
apply_explicit_binding(struct _mesa_glsl_parse_state *state,
                       YYLTYPE *loc,
                       ir_variable *var,
                       const glsl_type *type,
                       const ast_type_qualifier *qual)
{
   if (!qual->flags.q.uniform && !qual->flags.q.buffer) {
      _mesa_glsl_error(loc, state,
                       "the \"binding\" qualifier only applies to uniforms and "
                       "shader storage buffer objects");
      return;
   }

   unsigned qual_binding;
   if (!process_qualifier_constant(state, loc, "binding", qual->binding,
                                   &qual_binding)) {
      return;
   }

   const struct gl_context *const ctx = state->ctx;
   unsigned elements = type->is_array() ? type->arrays_of_arrays_size() : 1;
   unsigned max_index = qual_binding + elements - 1;
   const glsl_type *base_type = type->without_array();

   if (base_type->is_interface()) {
      /* UBOs.  From page 60 of the GLSL 4.20 specification:
       * "If the binding point for any uniform block instance is less than zero,
       *  or greater than or equal to the implementation-dependent maximum
       *  number of uniform buffer bindings, a compilation error will occur.
       *  When the binding identifier is used with a uniform block instanced as
       *  an array of size N, all elements of the array from binding through
       *  binding + N – 1 must be within this range."
       *
       * The implementation-dependent maximum is GL_MAX_UNIFORM_BUFFER_BINDINGS.
       */
      if (qual->flags.q.uniform &&
         max_index >= ctx->Const.MaxUniformBufferBindings) {
         _mesa_glsl_error(loc, state, "layout(binding = %u) for %d UBOs exceeds "
                          "the maximum number of UBO binding points (%d)",
                          qual_binding, elements,
                          ctx->Const.MaxUniformBufferBindings);
         return;
      }

      /* SSBOs. From page 67 of the GLSL 4.30 specification:
       * "If the binding point for any uniform or shader storage block instance
       *  is less than zero, or greater than or equal to the
       *  implementation-dependent maximum number of uniform buffer bindings, a
       *  compile-time error will occur. When the binding identifier is used
       *  with a uniform or shader storage block instanced as an array of size
       *  N, all elements of the array from binding through binding + N – 1 must
       *  be within this range."
       */
      if (qual->flags.q.buffer &&
         max_index >= ctx->Const.MaxShaderStorageBufferBindings) {
         _mesa_glsl_error(loc, state, "layout(binding = %u) for %d SSBOs exceeds "
                          "the maximum number of SSBO binding points (%d)",
                          qual_binding, elements,
                          ctx->Const.MaxShaderStorageBufferBindings);
         return;
      }
   } else if (base_type->is_sampler()) {
      /* Samplers.  From page 63 of the GLSL 4.20 specification:
       * "If the binding is less than zero, or greater than or equal to the
       *  implementation-dependent maximum supported number of units, a
       *  compilation error will occur. When the binding identifier is used
       *  with an array of size N, all elements of the array from binding
       *  through binding + N - 1 must be within this range."
       */
      unsigned limit = ctx->Const.MaxCombinedTextureImageUnits;

      if (max_index >= limit) {
         _mesa_glsl_error(loc, state, "layout(binding = %d) for %d samplers "
                          "exceeds the maximum number of texture image units "
                          "(%u)", qual_binding, elements, limit);

         return;
      }
   } else if (base_type->contains_atomic()) {
      assert(ctx->Const.MaxAtomicBufferBindings <= MAX_COMBINED_ATOMIC_BUFFERS);
      if (qual_binding >= ctx->Const.MaxAtomicBufferBindings) {
         _mesa_glsl_error(loc, state, "layout(binding = %d) exceeds the "
                          "maximum number of atomic counter buffer bindings "
                          "(%u)", qual_binding,
                          ctx->Const.MaxAtomicBufferBindings);

         return;
      }
   } else if ((state->is_version(420, 310) ||
               state->ARB_shading_language_420pack_enable) &&
              base_type->is_image()) {
      assert(ctx->Const.MaxImageUnits <= MAX_IMAGE_UNITS);
      if (max_index >= ctx->Const.MaxImageUnits) {
         _mesa_glsl_error(loc, state, "Image binding %d exceeds the "
                          "maximum number of image units (%d)", max_index,
                          ctx->Const.MaxImageUnits);
         return;
      }

   } else {
      _mesa_glsl_error(loc, state,
                       "the \"binding\" qualifier only applies to uniform "
                       "blocks, storage blocks, opaque variables, or arrays "
                       "thereof");
      return;
   }

   var->data.explicit_binding = true;
   var->data.binding = qual_binding;

   return;
}